

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O1

void anon_unknown.dwarf_2c92::parseComponents(ndicapi *api,char *data)

{
  ushort *puVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  ushort uVar8;
  uint uVar9;
  float *pfVar10;
  long lVar11;
  ulong uVar12;
  char (*pacVar13) [20];
  ulong uVar14;
  ushort *puVar15;
  uint uVar16;
  float *pfVar17;
  ulong uVar18;
  uint uVar19;
  
  api->Bx2GBFVersion = *(unsigned_short *)data;
  uVar3 = *(ushort *)(data + 2);
  if (uVar3 != 0) {
    puVar15 = (ushort *)(data + 4);
    uVar19 = 0;
    do {
      uVar4 = *puVar15;
      iVar5 = *(int *)(puVar15 + 1);
      iVar7 = (uint)*(byte *)((long)puVar15 + 0xb) * 0x1000000;
      iVar6 = (uint)(byte)puVar15[5] * 0x10000;
      uVar8 = puVar15[4];
      uVar9 = iVar6 + iVar7 | (uint)*(byte *)((long)puVar15 + 9) << 8 | (uint)(byte)puVar15[4];
      puVar1 = puVar15 + 6;
      if (uVar4 < 3) {
        if (uVar4 == 1) {
          api->Bx2FrameType = (uchar)puVar15[6];
          api->Bx2FrameSequenceIndex = *(uchar *)((long)puVar15 + 0xd);
          api->Bx2FrameNumber = *(uint *)(puVar15 + 8);
          puVar15 = puVar15 + 10;
          lVar11 = 0x48a0;
          do {
            *(char *)((long)&api->SerialDevice + lVar11) = (char)*puVar15;
            puVar15 = (ushort *)((long)puVar15 + 1);
            lVar11 = lVar11 + -1;
          } while (lVar11 != 0x4898);
          parseComponents(api,(char *)puVar15);
        }
        else if (uVar4 == 2) {
          uVar16 = 0x18;
          if (uVar9 < 0x18) {
            uVar16 = uVar9;
          }
          api->Bx2HandleCount = uVar16;
          if (uVar9 != 0) {
            uVar12 = (ulong)((uint)uVar8 + iVar7 + iVar6);
            if (0x17 < uVar12) {
              uVar12 = 0x18;
            }
            uVar14 = 0;
            pfVar10 = api->Bx2Transforms[0] + 7;
            puVar15 = puVar1;
            do {
              api->Bx2Handles[uVar14] = *puVar15;
              bVar2 = *(byte *)((long)puVar15 + 3);
              api->Bx2HandlesStatus[uVar14] = puVar15[1];
              if ((bVar2 & 2) != 0) {
                api->Bx2HandleAveragingEnabled[uVar14] = true;
              }
              if ((bVar2 & 1) == 0) {
                (*(float (*) [8])(pfVar10 + -7))[0] = *(float *)(puVar15 + 2);
                pfVar10[-6] = *(float *)(puVar15 + 4);
                pfVar10[-5] = *(float *)(puVar15 + 6);
                pfVar10[-4] = *(float *)(puVar15 + 8);
                pfVar10[-3] = *(float *)(puVar15 + 10);
                pfVar10[-2] = *(float *)(puVar15 + 0xc);
                pfVar10[-1] = *(float *)(puVar15 + 0xe);
                *pfVar10 = *(float *)(puVar15 + 0x10);
                puVar15 = puVar15 + 0x12;
              }
              else {
                puVar15 = puVar15 + 2;
              }
              uVar14 = uVar14 + 1;
              pfVar10 = pfVar10 + 8;
            } while (uVar12 != uVar14);
          }
        }
      }
      else if (uVar4 == 3) {
        if (uVar9 != 0) {
          uVar12 = (ulong)uVar9;
          if (0x17 < uVar9) {
            uVar12 = 0x18;
          }
          uVar14 = 0;
          pacVar13 = api->Bx2_3DMarkerStatus;
          pfVar10 = api->Bx2_3DMarkerPosition[0][0] + 2;
          puVar15 = puVar1;
          do {
            uVar4 = puVar15[1];
            puVar15 = puVar15 + 2;
            if (uVar4 != 0) {
              uVar18 = 0;
              pfVar17 = pfVar10;
              do {
                (*pacVar13)[uVar18] = (char)*puVar15;
                (*(float (*) [3])(pfVar17 + -2))[0] = *(float *)(puVar15 + 2);
                pfVar17[-1] = *(float *)(puVar15 + 4);
                *pfVar17 = *(float *)(puVar15 + 6);
                uVar18 = uVar18 + 1;
                pfVar17 = pfVar17 + 3;
                puVar15 = puVar15 + 8;
              } while (uVar4 != uVar18);
            }
            uVar14 = uVar14 + 1;
            pfVar10 = pfVar10 + 0x3c;
            pacVar13 = pacVar13 + 1;
          } while (uVar14 != uVar12);
        }
      }
      else if ((uVar4 == 0x12) && (api->Bx2SystemAlertsCount = uVar9, uVar9 != 0)) {
        lVar11 = 0;
        do {
          uVar16 = (uint)lVar11 & 0xffff;
          api->Bx2SystemAlerts[uVar16][0] = puVar15[lVar11 * 2 + 6];
          api->Bx2SystemAlerts[uVar16][1] = puVar15[lVar11 * 2 + 7];
          lVar11 = lVar11 + 1;
        } while (((uint)lVar11 & 0xffff) < uVar9);
      }
      puVar15 = (ushort *)((long)puVar1 + (ulong)(iVar5 - 0xc));
      uVar19 = uVar19 + 1;
    } while (uVar19 != uVar3);
  }
  return;
}

Assistant:

void parseComponents(ndicapi* api, const char* data)
  {
    const char* componentIndex = data;

    // GBF version
    api->Bx2GBFVersion = (unsigned char)componentIndex[1] << 8 | (unsigned char)componentIndex[0];
    componentIndex += 2;
    // GBF Component count
    unsigned short componentCount = (unsigned char)componentIndex[1] << 8 | (unsigned char)componentIndex[0];
    componentIndex += 2;

    unsigned int totalSkipLength(0);
    for (unsigned short i = 0; i < componentCount; ++i)
    {
      // Component
      unsigned short componentType = (unsigned char)componentIndex[1] << 8 | (unsigned char)componentIndex[0];
      componentIndex += 2;
      unsigned int componentSize = (unsigned char)componentIndex[3] << 24 | (unsigned char)componentIndex[2] << 16 | (unsigned char)componentIndex[1] << 8 | (unsigned char)componentIndex[0];
      componentIndex += 4;
      unsigned short itemOption = (unsigned char)componentIndex[1] << 8 | (unsigned char)componentIndex[0];
      componentIndex += 2;
      unsigned int itemCount = (unsigned char)componentIndex[3] << 24 | (unsigned char)componentIndex[2] << 16 | (unsigned char)componentIndex[1] << 8 | (unsigned char)componentIndex[0];
      componentIndex += 4;

      switch (componentType)
      {
      case NDI_COMPONENTID_FRAME:
        parseFrameComponent(api, componentIndex, itemOption, itemCount);
        break;
      case NDI_COMPONENTID_6D:
        parse6DComponent(api, componentIndex, itemOption, itemCount);
        break;
      case NDI_COMPONENTID_3D:
        parse3DComponent(api, componentIndex, itemOption, itemCount);
        break;
      case NDI_COMPONENTID_1D:
        parse1DComponent(api, componentIndex, itemOption, itemCount);
        break;
      case NDI_COMPONENTID_2D:
        parse2DComponent(api, componentIndex, itemOption, itemCount);
        break;
      case NDI_COMPONENTID_LINE_SEP:
        parseLineSepComponent(api, componentIndex, itemOption, itemCount);
        break;
      case NDI_COMPONENTID_3D_ERROR:
        parse3DErrorComponent(api, componentIndex, itemOption, itemCount);
        break;
      case NDI_COMPONENTID_IMAGE:
        parse1DImageComponent(api, componentIndex, itemOption, itemCount);
        break;
      case NDI_COMPONENTID_UV:
        parseUVComponent(api, componentIndex, itemOption, itemCount);
        break;
      case NDI_COMPONENTID_SYS_ALERT:
        parseSystemAlertComponent(api, componentIndex, itemOption, itemCount);
        break;
      default:
        // Unknown component type, do nothing
        break;
      }

      componentIndex += componentSize - 12; // skip component size - header size
    }
  }